

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::__cxx11::string>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  bool bVar1;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value_1;
  int local_70;
  char nc;
  char c;
  string local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.field_2._8_8_ = result;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)local_48);
    bVar1 = ReadBasicType(this,(string *)local_48);
    if (bVar1) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)value.field_2._8_8_,(value_type *)local_48);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_68,"Not starting with the value of requested type.\n",
                 (allocator *)&c);
      PushError(this,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    ::std::__cxx11::string::~string((string *)local_48);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005af70d;
        }
        bVar1 = Char1(this,value_1.field_2._M_local_buf + 0xf);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005af70d;
        }
        if (value_1.field_2._M_local_buf[0xf] == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005af70d;
          }
          bVar1 = LookChar1(this,value_1.field_2._M_local_buf + 0xe);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005af70d;
          }
          if (value_1.field_2._M_local_buf[0xe] == end_symbol) break;
        }
        if (value_1.field_2._M_local_buf[0xf] != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005af70d;
        }
        ::std::__cxx11::string::string((string *)local_98);
        bVar1 = ReadBasicType(this,(string *)local_98);
        if (bVar1) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)value.field_2._8_8_,(value_type *)local_98);
          local_70 = 0;
        }
        else {
          local_70 = 3;
        }
        ::std::__cxx11::string::~string((string *)local_98);
      } while (local_70 == 0);
      bVar1 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)value.field_2._8_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_b8,"Empty array.\n",&local_b9);
        PushError(this,&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005af70d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}